

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

int __thiscall
SkylineBinPack::ComputeWastedArea
          (SkylineBinPack *this,int skylineNodeIndex,int width,int height,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  SkylineNode *pSVar6;
  int *piVar7;
  int iVar8;
  
  lVar4 = (long)skylineNodeIndex;
  pSVar6 = (this->skyLine).Array + lVar4;
  iVar1 = pSVar6->x;
  iVar5 = width + iVar1;
  iVar3 = 0;
  for (piVar7 = &pSVar6->width;
      ((lVar4 < (int)(this->skyLine).Count &&
       (iVar2 = ((SkylineNode *)(piVar7 + -2))->x, iVar2 < iVar5)) &&
      (iVar8 = *piVar7 + iVar2, iVar1 < iVar8)); piVar7 = piVar7 + 3) {
    if (y < piVar7[-1]) {
      __assert_fail("y >= skyLine[skylineNodeIndex].y",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0xa2,"int SkylineBinPack::ComputeWastedArea(int, int, int, int) const");
    }
    if (iVar5 < iVar8) {
      iVar8 = iVar5;
    }
    iVar3 = iVar3 + (y - piVar7[-1]) * (iVar8 - iVar2);
    lVar4 = lVar4 + 1;
  }
  return iVar3;
}

Assistant:

int SkylineBinPack::ComputeWastedArea(int skylineNodeIndex, int width, int height, int y) const
{
	int wastedArea = 0;
	const int rectLeft = skyLine[skylineNodeIndex].x;
	const int rectRight = rectLeft + width;
	for(; skylineNodeIndex < (int)skyLine.Size() && skyLine[skylineNodeIndex].x < rectRight; ++skylineNodeIndex)
	{
		if (skyLine[skylineNodeIndex].x >= rectRight || skyLine[skylineNodeIndex].x + skyLine[skylineNodeIndex].width <= rectLeft)
			break;

		int leftSide = skyLine[skylineNodeIndex].x;
		int rightSide = MIN(rectRight, leftSide + skyLine[skylineNodeIndex].width);
		assert(y >= skyLine[skylineNodeIndex].y);
		wastedArea += (rightSide - leftSide) * (y - skyLine[skylineNodeIndex].y);
	}
	return wastedArea;
}